

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void __thiscall Js::JavascriptNativeIntArray::ValidateArray(JavascriptNativeIntArray *this)

{
  SparseArraySegmentBase *seg;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *pTVar4;
  
  if (Configuration::Global != '\0') {
    JavascriptArray::ValidateArrayCommon((JavascriptArray *)this);
    JavascriptArray::ValidateSegment<int>
              ((SparseArraySegment<int> *)
               (this->super_JavascriptNativeArray).super_JavascriptArray.head.ptr);
    return;
  }
  pTVar4 = &(this->super_JavascriptNativeArray).super_JavascriptArray.head;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  while( true ) {
    do {
      do {
        seg = pTVar4->ptr;
        if (seg == (SparseArraySegmentBase *)0x0) {
          return;
        }
        pTVar4 = &seg->next;
      } while ((seg->next).ptr == (SparseArraySegmentBase *)0x0);
      bVar2 = SparseArraySegmentBase::IsLeafSegment
                        (seg,((((((this->super_JavascriptNativeArray).super_JavascriptArray.
                                  super_ArrayObject.super_DynamicObject.super_RecyclableObject.type.
                                 ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                              scriptContext.ptr)->recycler);
    } while (!bVar2);
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2e89,
                                "(!SparseArraySegmentBase::IsLeafSegment(seg, this->GetScriptContext()->GetRecycler()))"
                                ,"Leaf segment with a next pointer");
    if (!bVar2) break;
    *puVar3 = 0;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void JavascriptNativeIntArray::ValidateArray()
    {
        if (!Js::Configuration::Global.flags.ArrayValidate)
        {
#if DBG
            SparseArraySegmentBase *seg = head;
            while (seg)
            {
                if (seg->next != nullptr)
                {
                    AssertMsg(!SparseArraySegmentBase::IsLeafSegment(seg, this->GetScriptContext()->GetRecycler()), "Leaf segment with a next pointer");
                }
                seg = seg->next;
            }
#endif
            return;
        }
        ValidateArrayCommon();
        // Detailed segments validation
        JavascriptArray::ValidateSegment<int32>(SparseArraySegment<int32>::From(head));
    }